

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_EnvelopePrepare(ym3438_t *chip)

{
  uint uVar1;
  byte bVar2;
  Bit8u local_19;
  byte local_13;
  Bit8u rate_sel;
  Bit32u slot;
  Bit8u inc;
  Bit8u sum;
  Bit8u rate;
  ym3438_t *chip_local;
  
  local_13 = 0;
  uVar1 = chip->cycles;
  rate_sel = chip->eg_rate * '\x02' + chip->eg_ksv;
  if (0x3f < rate_sel) {
    rate_sel = '?';
  }
  bVar2 = (char)((int)(uint)rate_sel >> 2) + chip->eg_shift_lock & 0xf;
  if ((chip->eg_rate != '\0') && (chip->eg_quotient == 2)) {
    if (rate_sel < 0x30) {
      if (bVar2 == 0xc) {
        local_13 = 1;
      }
      else if (bVar2 == 0xd) {
        local_13 = (byte)((int)(uint)rate_sel >> 1) & 1;
      }
      else if (bVar2 == 0xe) {
        local_13 = rate_sel & 1;
      }
    }
    else {
      local_13 = ((char)eg_stephi[(int)(rate_sel & 3)][chip->eg_timer_low_lock] +
                 (char)((int)(uint)rate_sel >> 2)) - 0xb;
      if (4 < local_13) {
        local_13 = 4;
      }
    }
  }
  chip->eg_inc = local_13;
  chip->eg_ratemax = (int)(uint)rate_sel >> 1 == 0x1f;
  local_19 = chip->eg_state[uVar1];
  if (((chip->eg_kon[uVar1] != '\0') && (chip->eg_ssg_repeat_latch[uVar1] != '\0')) ||
     ((chip->eg_kon[uVar1] == '\0' && (chip->eg_kon_latch[uVar1] != '\0')))) {
    local_19 = '\0';
  }
  switch(local_19) {
  case '\0':
    chip->eg_rate = chip->ar[uVar1];
    break;
  case '\x01':
    chip->eg_rate = chip->dr[uVar1];
    break;
  case '\x02':
    chip->eg_rate = chip->sr[uVar1];
    break;
  case '\x03':
    chip->eg_rate = chip->rr[uVar1] << 1 | 1;
  }
  chip->eg_ksv = (Bit8u)((int)(uint)chip->pg_kcode >> ((chip->ks[uVar1] ^ 3) & 0x1f));
  if (chip->am[uVar1] == '\0') {
    chip->eg_lfo_am = '\0';
  }
  else {
    chip->eg_lfo_am =
         (Bit8u)((int)(uint)chip->lfo_am >> ("\a\x03\x01"[chip->ams[chip->channel]] & 0x1f));
  }
  chip->eg_tl[1] = chip->eg_tl[0];
  chip->eg_tl[0] = chip->tl[uVar1];
  chip->eg_sl[1] = chip->eg_sl[0];
  chip->eg_sl[0] = chip->sl[uVar1];
  return;
}

Assistant:

void OPN2_EnvelopePrepare(ym3438_t *chip)
{
    Bit8u rate;
    Bit8u sum;
    Bit8u inc = 0;
    Bit32u slot = chip->cycles;
    Bit8u rate_sel;

    /* Prepare increment */
    rate = (chip->eg_rate << 1) + chip->eg_ksv;

    if (rate > 0x3f)
    {
        rate = 0x3f;
    }

    sum = ((rate >> 2) + chip->eg_shift_lock) & 0x0f;
    if (chip->eg_rate != 0 && chip->eg_quotient == 2)
    {
        if (rate < 48)
        {
            switch (sum)
            {
            case 12:
                inc = 1;
                break;
            case 13:
                inc = (rate >> 1) & 0x01;
                break;
            case 14:
                inc = rate & 0x01;
                break;
            default:
                break;
            }
        }
        else
        {
            inc = eg_stephi[rate & 0x03][chip->eg_timer_low_lock] + (rate >> 2) - 11;
            if (inc > 4)
            {
                inc = 4;
            }
        }
    }
    chip->eg_inc = inc;
    chip->eg_ratemax = (rate >> 1) == 0x1f;

    /* Prepare rate & ksv */
    rate_sel = chip->eg_state[slot];
    if ((chip->eg_kon[slot] && chip->eg_ssg_repeat_latch[slot])
     || (!chip->eg_kon[slot] && chip->eg_kon_latch[slot]))
    {
        rate_sel = eg_num_attack;
    }
    switch (rate_sel)
    {
    case eg_num_attack:
        chip->eg_rate = chip->ar[slot];
        break;
    case eg_num_decay:
        chip->eg_rate = chip->dr[slot];
        break;
    case eg_num_sustain:
        chip->eg_rate = chip->sr[slot];
        break;
    case eg_num_release:
        chip->eg_rate = (chip->rr[slot] << 1) | 0x01;
        break;
    default:
        break;
    }
    chip->eg_ksv = chip->pg_kcode >> (chip->ks[slot] ^ 0x03);
    if (chip->am[slot])
    {
        chip->eg_lfo_am = chip->lfo_am >> eg_am_shift[chip->ams[chip->channel]];
    }
    else
    {
        chip->eg_lfo_am = 0;
    }
    /* Delay TL & SL value */
    chip->eg_tl[1] = chip->eg_tl[0];
    chip->eg_tl[0] = chip->tl[slot];
    chip->eg_sl[1] = chip->eg_sl[0];
    chip->eg_sl[0] = chip->sl[slot];
}